

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void us_internal_socket_context_unlink(us_socket_context_t *context,us_socket_t *s)

{
  us_socket_t *s_local;
  us_socket_context_t *context_local;
  
  if (s == context->iterator) {
    context->iterator = s->next;
  }
  if (s->prev == s->next) {
    context->head = (us_socket_t *)0x0;
  }
  else {
    if (s->prev == (us_socket_t *)0x0) {
      context->head = s->next;
    }
    else {
      s->prev->next = s->next;
    }
    if (s->next != (us_socket_t *)0x0) {
      s->next->prev = s->prev;
    }
  }
  return;
}

Assistant:

void us_internal_socket_context_unlink(struct us_socket_context_t *context, struct us_socket_t *s) {
    /* We have to properly update the iterator used to sweep sockets for timeouts */
    if (s == context->iterator) {
        context->iterator = s->next;
    }

    if (s->prev == s->next) {
        context->head = 0;
    } else {
        if (s->prev) {
            s->prev->next = s->next;
        } else {
            context->head = s->next;
        }
        if (s->next) {
            s->next->prev = s->prev;
        }
    }
}